

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O0

bool anon_unknown.dwarf_6cd17b::LoadCELHeader(FileReader *file,CELHeader *header)

{
  int iVar1;
  undefined4 extraout_var;
  CELHeader *header_local;
  FileReader *file_local;
  
  iVar1 = (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,header,0x20);
  if (CONCAT44(extraout_var,iVar1) == 0x20) {
    header->magic = header->magic;
    header->width = header->width;
    header->height = header->height;
    header->x = header->x;
    header->y = header->y;
    header->size = header->size;
    if ((((header->magic == 0x9119) && (header->width != 0)) && (header->height != 0)) &&
       (((header->size != 0 && ((uint)header->width * (uint)header->height == header->size)) &&
        ((header->depth == '\b' && (header->compress == '\0')))))) {
      file_local._7_1_ = true;
    }
    else {
      file_local._7_1_ = false;
    }
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool LoadCELHeader(FileReader& file, CELHeader& header)
	{
		if (sizeof header != file.Read(&header, sizeof header))
		{
			return false;
		}

		header.magic  = LittleShort(header.magic);
		header.width  = LittleShort(header.width);
		header.height = LittleShort(header.height);
		header.x      = LittleShort(header.x);
		header.y      = LittleShort(header.y);
		header.size   = LittleLong (header.size);

		if (0x9119 != header.magic
			|| 0 == header.width
			|| 0 == header.height
			|| 0 == header.size
			|| header.width * header.height != header.size
			|| 8 != header.depth
			|| 0 != header.compress)
		{
			return false;
		}

		return true;
	}